

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O1

void __thiscall
duckdb::ViewRelation::ViewRelation
          (ViewRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *ref,
          string *view_name)

{
  pointer pcVar1;
  pointer pTVar2;
  pointer *__ptr;
  
  Relation::Relation(&this->super_Relation,context,VIEW_RELATION);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__ViewRelation_024b3570;
  (this->schema_name)._M_dataplus._M_p = (pointer)&(this->schema_name).field_2;
  (this->schema_name)._M_string_length = 0;
  (this->schema_name).field_2._M_local_buf[0] = '\0';
  (this->view_name)._M_dataplus._M_p = (pointer)&(this->view_name).field_2;
  pcVar1 = (view_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->view_name,pcVar1,pcVar1 + view_name->_M_string_length);
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->premade_tableref).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (ref->super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (ref->super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
  Relation::TryBindRelation(&this->super_Relation,&this->columns);
  pTVar2 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     (&this->premade_tableref);
  ::std::__cxx11::string::_M_assign((string *)&pTVar2->alias);
  return;
}

Assistant:

ViewRelation::ViewRelation(const shared_ptr<ClientContext> &context, unique_ptr<TableRef> ref, const string &view_name)
    : Relation(context, RelationType::VIEW_RELATION), view_name(view_name), premade_tableref(std::move(ref)) {
	TryBindRelation(columns);
	premade_tableref->alias = view_name;
}